

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

void __thiscall Js::PathTypeHandlerBase::LockInlineSlotCapacity(PathTypeHandlerBase *this)

{
  PathTypeSuccessorInfo *pPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x9ef,"(!GetIsInlineSlotCapacityLocked())",
                                "!GetIsInlineSlotCapacityLocked()");
    if (!bVar3) goto LAB_00c4be30;
    *puVar4 = 0;
  }
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  pPVar1 = (this->successorInfo).ptr;
  if (pPVar1 != (PathTypeSuccessorInfo *)0x0) {
    if (pPVar1->kind == PathTypeSuccessorKindSingle) {
      if ((*(long **)(pPVar1 + 0x10) != (long *)0x0) &&
         (lVar6 = **(long **)(pPVar1 + 0x10), lVar6 != 0)) {
        (**(code **)(**(long **)(lVar6 + 0x28) + 0x1f0))();
        return;
      }
    }
    else {
      lVar6 = *(long *)(pPVar1 + 8);
      if (lVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xdf,"(this->propertySuccessors)","this->propertySuccessors");
        if (!bVar3) {
LAB_00c4be30:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
        lVar6 = *(long *)(pPVar1 + 8);
      }
      for (uVar7 = 0; uVar7 < *(uint *)(lVar6 + 0x24); uVar7 = uVar7 + 1) {
        iVar8 = *(int *)(*(long *)(lVar6 + 8) + uVar7 * 4);
        if (iVar8 != -1) {
          while (iVar8 != -1) {
            lVar5 = (long)iVar8;
            iVar8 = *(int *)(*(long *)(lVar6 + 0x10) + 8 + lVar5 * 0x18);
            lVar5 = **(long **)(*(long *)(lVar6 + 0x10) + lVar5 * 0x18);
            if (lVar5 != 0) {
              (**(code **)(**(long **)(lVar5 + 0x28) + 0x1f0))();
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void PathTypeHandlerBase::LockInlineSlotCapacity()
    {
        Assert(!GetIsInlineSlotCapacityLocked());
        SetIsInlineSlotCapacityLocked();

        this->MapSuccessors([](const PathTypeSuccessorKey, RecyclerWeakReference<DynamicType>* typeWeakReference)
        {
            DynamicType * type = typeWeakReference->Get();
            if (!type)
            {
                return;
            }

            type->GetTypeHandler()->LockInlineSlotCapacity();
        });
    }